

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void __thiscall
ThreadContext::ReleaseTemporaryGuestAllocator
          (ThreadContext *this,TempGuestArenaAllocatorObject *tempGuestAllocator)

{
  RecyclableData *pRVar1;
  
  if (this->temporaryGuestArenaAllocatorCount < 5) {
    Js::TempArenaAllocatorWrapper<true>::AdviseNotInUse(tempGuestAllocator);
    pRVar1 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    Memory::WriteBarrierPtr<Js::TempArenaAllocatorWrapper<true>_>::WriteBarrierSet
              (pRVar1->temporaryGuestArenaAllocators + this->temporaryGuestArenaAllocatorCount,
               tempGuestAllocator);
    this->temporaryGuestArenaAllocatorCount = this->temporaryGuestArenaAllocatorCount + 1;
    return;
  }
  Js::TempArenaAllocatorWrapper<true>::Dispose(tempGuestAllocator,false);
  return;
}

Assistant:

void
ThreadContext::ReleaseTemporaryGuestAllocator(Js::TempGuestArenaAllocatorObject * tempGuestAllocator)
{
    if (temporaryGuestArenaAllocatorCount < MaxTemporaryArenaAllocators)
    {
        tempGuestAllocator->AdviseNotInUse();
        recyclableData->temporaryGuestArenaAllocators[temporaryGuestArenaAllocatorCount] = tempGuestAllocator;
        temporaryGuestArenaAllocatorCount++;
        return;
    }

    tempGuestAllocator->Dispose(false);
}